

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O0

void __thiscall
Shell::PlainALManager::recordSkolemBinding(PlainALManager *this,Term *skT,uint var,string *vName)

{
  pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_RDI;
  Stack<std::pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Stack<std::pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [2];
  
  elem = (pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(in_RDI + 0x80);
  this_00 = local_48;
  std::make_pair<Kernel::Term*&,std::__cxx11::string&>((Term **)elem,in_RCX);
  Lib::
  Stack<std::pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push(this_00,elem);
  std::
  pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0xb7c550);
  return;
}

Assistant:

void PlainALManager::recordSkolemBinding(Term* skT,unsigned var,std::string vName)
{
  _skolemNames.push(std::make_pair(skT,vName));
}